

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cc
# Opt level: O0

void __thiscall
klogic::mvn::learn(mvn *this,const_iterator Xbeg,const_iterator Xend,cmplx *error,
                  double learning_rate,bool variable_rate)

{
  bool bVar1;
  size_type sVar2;
  difference_type dVar3;
  reference pcVar4;
  reference __z;
  double dVar5;
  double __d;
  undefined1 auVar6 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_a0;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_98;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_90;
  const_iterator x;
  iterator w;
  undefined1 local_70 [16];
  double local_60;
  complex<double> local_58;
  undefined1 local_48 [8];
  cmplx factor;
  double dStack_30;
  bool variable_rate_local;
  double learning_rate_local;
  cmplx *error_local;
  mvn *this_local;
  const_iterator Xend_local;
  const_iterator Xbeg_local;
  
  factor._M_value[0xf] = variable_rate;
  dStack_30 = learning_rate;
  learning_rate_local = (double)error;
  error_local = (cmplx *)this;
  this_local = (mvn *)Xend._M_current;
  Xend_local = Xbeg;
  sVar2 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                    (&this->weights);
  dVar3 = __gnu_cxx::operator-
                    ((__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                      *)&this_local,&Xend_local);
  if (sVar2 == dVar3 + 1U) {
    std::operator*((complex<double> *)learning_rate_local,&stack0xffffffffffffffd0);
    sVar2 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                      (&this->weights);
    auVar6._8_4_ = (int)(sVar2 >> 0x20);
    auVar6._0_8_ = sVar2;
    auVar6._12_4_ = 0x45300000;
    dVar5 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
    local_60 = (auVar6._8_8_ - 1.9342813113834067e+25) + dVar5;
    std::operator/(&local_58,&local_60);
    factor._M_value._0_8_ = dVar5;
    if ((factor._M_value[0xf] & 1) != 0) {
      weighted_sum(this,Xend_local,(const_iterator)this_local);
      local_70._8_8_ = dVar5;
      __d = std::abs<double>((complex<double> *)local_70);
      std::complex<double>::operator/=((complex<double> *)local_48,__d);
    }
    x._M_current = (complex<double> *)
                   std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                             (&this->weights);
    local_90._M_current = Xend_local._M_current;
    local_98 = __gnu_cxx::
               __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
               ::operator++((__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                             *)&x,0);
    pcVar4 = __gnu_cxx::
             __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
             ::operator*(&local_98);
    std::complex<double>::operator+=(pcVar4,(complex<double> *)local_48);
    while( true ) {
      local_a0._M_current =
           (complex<double> *)
           std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
                     (&this->weights);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                          *)&x,&local_a0);
      if (!bVar1) break;
      __z = __gnu_cxx::
            __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
            ::operator*(&local_90);
      std::conj<double>(__z);
      local_c0._8_8_ = dVar5;
      std::operator*((complex<double> *)local_48,(complex<double> *)local_c0);
      local_b0._8_8_ = dVar5;
      pcVar4 = __gnu_cxx::
               __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
               ::operator*((__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                            *)&x);
      std::complex<double>::operator+=(pcVar4,(complex<double> *)local_b0);
      __gnu_cxx::
      __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
      ::operator++((__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                    *)&x,0);
      __gnu_cxx::
      __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
      ::operator++(&local_90,0);
    }
    return;
  }
  __assert_fail("weights.size() == Xend - Xbeg + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mvn.cc",
                0x28,
                "void klogic::mvn::learn(cvector::const_iterator, cvector::const_iterator, const cmplx &, double, bool)"
               );
}

Assistant:

void klogic::mvn::learn(cvector::const_iterator Xbeg,
                        cvector::const_iterator Xend,
                        const cmplx &error, double learning_rate, bool variable_rate)
{
    assert(weights.size() == Xend - Xbeg + 1);

    cmplx factor = error * learning_rate / (double)weights.size(); // division by N+1

    if (variable_rate)
        factor /= std::abs(weighted_sum(Xbeg, Xend));

    cvector::iterator       w = weights.begin();
    cvector::const_iterator x = Xbeg;

    // cout << "learn(): error=" << error << " factor=" << factor << "weights before: " << weights_vector() << endl;

    *w++ += factor;         // change bias

    for (; w != weights.end(); w++, x++) {
        *w += factor * std::conj(*x);
    }

    // cout << "learn(): weights after: " << weights_vector() << endl;

}